

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t *pwVar1;
  undefined1 *puVar2;
  int64_t *piVar3;
  compressed_block_header cVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  rar5 *prVar8;
  size_t __size;
  void *pvVar9;
  ulong uVar10;
  ushort uVar11;
  archive_read *a_00;
  uint16_t uVar12;
  byte bVar13;
  wchar_t wVar14;
  int iVar15;
  int iVar16;
  uint32_t uVar17;
  wchar_t wVar18;
  size_t sVar19;
  uint8_t *puVar20;
  uint *puVar21;
  void *pvVar22;
  long lVar23;
  uint32_t uVar24;
  long lVar25;
  byte bVar26;
  char *pcVar27;
  ulong uVar28;
  uint uVar29;
  uint8_t uVar30;
  ulong uVar31;
  rar5 *prVar32;
  long lVar33;
  rar5 *prVar34;
  rar5 *prVar35;
  data_ready *pdVar36;
  size_t sVar37;
  uint uVar38;
  uint8_t *puVar39;
  decode_table *pdVar40;
  bool bVar41;
  ushort local_272;
  archive_read *local_270;
  rar5 *local_268;
  uint8_t *local_260;
  uint16_t num;
  uint16_t num_1;
  uint8_t *p;
  uint8_t *local_248;
  rar5 *local_240;
  decode_table *local_238;
  uint8_t *local_230;
  uint8_t bit_length [20];
  uint8_t table [430];
  
  prVar8 = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  bVar13 = (prVar8->file).field_0x20;
  if ((bVar13 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((prVar8->skip_mode == L'\0') &&
     ((prVar8->file).unpacked_size < (prVar8->cstate).last_write_ptr)) {
    pcVar27 = "Unpacker has written too many bytes";
    iVar16 = 0x16;
    goto LAB_00149f0d;
  }
  if ((prVar8->cstate).dready[0].used != '\0') {
    pdVar36 = (prVar8->cstate).dready;
LAB_00149f55:
    if (buff != (void **)0x0) {
      *buff = pdVar36->buf;
    }
    if (size != (size_t *)0x0) {
      *size = pdVar36->size;
    }
    if (offset != (int64_t *)0x0) {
      *offset = pdVar36->offset;
    }
    pdVar36->used = '\0';
    return L'\0';
  }
  if ((prVar8->cstate).dready[1].used != '\0') {
    pdVar36 = (prVar8->cstate).dready + 1;
    goto LAB_00149f55;
  }
  if ((bVar13 & 4) != 0) {
    return L'\x01';
  }
  local_270 = a;
  local_240 = prVar8;
  if ((bVar13 & 2) == 0) {
    wVar18 = (prVar8->cstate).method;
    uVar28 = (ulong)(uint)wVar18;
    if ((uint)(wVar18 + L'\xffffffff') < 5) {
LAB_00149fbd:
      prVar8 = (rar5 *)a->format->data;
      bVar13 = *(byte *)&prVar8->cstate;
      if ((bVar13 & 1) == 0) {
        puVar39 = (prVar8->cstate).window_buf;
        if (((ulong)prVar8->main & 1) == 0) {
LAB_00149fe7:
          (prVar8->file).calculated_crc32 = 0;
          lVar23 = (prVar8->cstate).window_size;
          sVar19 = lVar23 - 1;
          if (lVar23 == 0) {
            sVar19 = 0;
          }
          (prVar8->cstate).window_mask = sVar19;
          free(puVar39);
          free((prVar8->cstate).filtered_buf);
          __size = (prVar8->cstate).window_size;
          puVar39 = (uint8_t *)0x0;
          puVar20 = (uint8_t *)0x0;
          if (0 < (long)__size) {
            puVar39 = (uint8_t *)calloc(1,__size);
            puVar20 = (uint8_t *)calloc(1,__size);
          }
          (prVar8->cstate).window_buf = puVar39;
          (prVar8->cstate).filtered_buf = puVar20;
          (prVar8->cstate).write_ptr = 0;
          (prVar8->cstate).last_write_ptr = 0;
          memset(&(prVar8->cstate).bd,0,0x4a9c);
          bVar13 = *(byte *)&prVar8->cstate;
        }
        else if (puVar39 == (uint8_t *)0x0) {
          puVar39 = (uint8_t *)0x0;
          goto LAB_00149fe7;
        }
        bVar13 = bVar13 | 1;
        *(byte *)&prVar8->cstate = bVar13;
      }
      if ((prVar8->cstate).window_size == 0) {
        pcVar27 = "Invalid window size declaration in this file";
        goto LAB_0014afdd;
      }
      if ((bVar13 & 2) != 0) {
LAB_0014a11e:
        prVar34 = (rar5 *)a->format->data;
        if (((((ulong)prVar34->main & 2) != 0) && ((prVar34->file).bytes_remaining == 0)) &&
           (wVar18 = advance_multivolume(a), wVar18 != L'\0')) goto LAB_0014ad8e;
        local_268 = prVar34;
        if ((undefined1  [19312])((undefined1  [19312])prVar34->cstate & (undefined1  [19312])0x8)
            == (undefined1  [19312])0x0) {
          p = (prVar34->cstate).block_buf;
          goto LAB_0014a2a9;
        }
        wVar18 = read_ahead(a,6,&p);
        if (wVar18 == L'\0') {
          return L'\x01';
        }
        cVar4.block_flags_u8 = p[0];
        cVar4.block_cksum = p[1];
        prVar34->last_block_hdr = cVar4;
        bVar13 = cVar4.block_flags_u8 >> 3 & 7;
        uVar28 = (ulong)bVar13;
        if (bVar13 < 3) {
          if (bVar13 == 2) {
            uVar28 = (ulong)(*(uint *)(p + 2) & 0xffffff);
          }
          else if (bVar13 == 1) {
            uVar28 = (ulong)*(ushort *)(p + 2);
          }
          else {
            uVar28 = (ulong)p[2];
          }
          if ((((uint)(uVar28 >> 0x10) ^ (uint)uVar28 ^
               (uint)(uVar28 >> 8) ^ (uint)(cVar4.block_flags_u8 ^ 0x5a)) & 0xff) !=
              (uint)((ushort)cVar4 >> 8)) {
            archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x");
            return L'\xffffffe2';
          }
          wVar18 = consume(a,(ulong)(byte)(bVar13 + 3));
          if (wVar18 != L'\0') {
            return L'\x01';
          }
          lVar23 = (prVar34->file).bytes_remaining - (ulong)(byte)(bVar13 + 3);
          (prVar34->file).bytes_remaining = lVar23;
          if ((long)uVar28 <= lVar23) {
            *(byte *)&prVar34->cstate = *(byte *)&prVar34->cstate & 0xfb;
            wVar18 = read_ahead(a,uVar28 + 4,&p);
            if (wVar18 == L'\0') {
              return L'\x01';
            }
LAB_0014a275:
            (prVar34->cstate).block_buf = p;
            (prVar34->cstate).cur_block_size = uVar28;
            *(byte *)&prVar34->cstate = *(byte *)&prVar34->cstate & 0xf7;
            (prVar34->bits).in_addr = L'\0';
            (prVar34->bits).bit_addr = '\0';
            if ((char)(prVar34->last_block_hdr).block_flags_u8 < '\0') {
              wVar18 = L'\0';
              iVar16 = 0;
              uVar38 = 0xf0;
              bVar13 = 4;
              do {
                bVar26 = bVar13 ^ 4;
                while( true ) {
                  local_260 = p;
                  if (0x13 < iVar16) {
                    (prVar34->bits).in_addr = wVar18;
                    (prVar34->bits).bit_addr = bVar13 ^ 4;
                    pdVar40 = &(prVar34->cstate).bd;
                    create_decode_tables(bit_length,pdVar40,L'\x14');
                    uVar38 = 0;
                    puVar39 = local_260;
                    goto LAB_0014aa4f;
                  }
                  if ((long)uVar28 <= (long)wVar18) {
                    iVar16 = 0x54;
                    pcVar27 = "Truncated data in huffman tables";
                    goto LAB_0014ad84;
                  }
                  uVar29 = (uVar38 & p[wVar18]) >> bVar13;
                  wVar18 = wVar18 + (uint)(uVar38 == 0xf);
                  lVar23 = (long)iVar16;
                  if (uVar29 != 0xf) break;
                  uVar29 = (uint)p[wVar18] & (uVar38 ^ 0xff);
                  wVar18 = wVar18 + (uint)(uVar38 == 0xf0);
                  a = local_270;
                  if (uVar29 >> bVar26 == 0) {
                    iVar16 = iVar16 + 1;
                    bit_length[lVar23] = '\x0f';
                  }
                  else {
                    for (lVar25 = 0;
                        ((uint)lVar25 < (uVar29 >> bVar26) + 2 && (lVar23 + lVar25 < 0x14));
                        lVar25 = lVar25 + 1) {
                      bit_length[lVar25 + lVar23] = '\0';
                    }
                    iVar16 = iVar16 + (uint)lVar25;
                    prVar34 = local_268;
                  }
                }
                iVar16 = iVar16 + 1;
                bit_length[lVar23] = (uint8_t)uVar29;
                uVar38 = uVar38 ^ 0xff;
                bVar13 = bVar26;
              } while( true );
            }
            goto LAB_0014a2a9;
          }
          pvVar9 = a->format->data;
          if (*(int *)((long)pvVar9 + 0xc) == 0) {
            *(byte *)((long)pvVar9 + 0x38) = *(byte *)((long)pvVar9 + 0x38) | 4;
            free(*(void **)((long)pvVar9 + 0x5320));
            pvVar22 = malloc(uVar28 + 8);
            *(void **)((long)pvVar9 + 0x5320) = pvVar22;
            if (pvVar22 != (void *)0x0) {
              *(undefined8 *)((long)pvVar22 + uVar28) = 0;
              uVar31 = 0;
              do {
                do {
                  a = local_270;
                  sVar19 = uVar28 - uVar31;
                  if ((long)*(size_t *)((long)pvVar9 + 0x4ba8) < (long)(uVar28 - uVar31)) {
                    sVar19 = *(size_t *)((long)pvVar9 + 0x4ba8);
                  }
                  if (sVar19 == 0) {
                    iVar16 = 0x54;
                    pcVar27 = "Encountered block size == 0 during block merge";
                    goto LAB_0014ad84;
                  }
                  wVar18 = read_ahead(local_270,sVar19,(uint8_t **)table);
                  if (wVar18 == L'\0') goto LAB_0014aa16;
                  uVar10 = sVar19 + uVar31;
                  if ((long)uVar28 < (long)uVar10) {
                    iVar16 = 0x16;
                    pcVar27 = "Consumed too much data when merging blocks.";
                    a = local_270;
                    goto LAB_0014ad84;
                  }
                  memcpy((void *)(uVar31 + *(long *)((long)pvVar9 + 0x5320)),(void *)table._0_8_,
                         sVar19);
                  wVar18 = consume(local_270,sVar19);
                  a = local_270;
                  if (wVar18 != L'\0') {
                    wVar18 = L'\x01';
                    goto LAB_0014ad8e;
                  }
                  sVar37 = *(size_t *)((long)pvVar9 + 0x4ba8);
                  *(size_t *)((long)pvVar9 + 0x4ba8) = sVar37 - sVar19;
                  if (uVar10 == uVar28) {
                    p = *(uint8_t **)((long)pvVar9 + 0x5320);
                    prVar34 = local_268;
                    goto LAB_0014a275;
                  }
                  uVar31 = uVar10;
                } while (sVar37 != sVar19);
                *(int *)((long)pvVar9 + 0xc) = *(int *)((long)pvVar9 + 0xc) + 1;
                wVar18 = advance_multivolume(local_270);
                *(int *)((long)pvVar9 + 0xc) = *(int *)((long)pvVar9 + 0xc) + -1;
                a = local_270;
              } while (wVar18 == L'\0');
              goto LAB_0014ad8e;
            }
            iVar16 = 0xc;
            pcVar27 = "Can\'t allocate memory for a merge block buffer.";
          }
          else {
            iVar16 = 0x16;
            pcVar27 = "Recursive merge is not allowed";
          }
LAB_0014ad84:
          archive_set_error(&a->archive,iVar16,pcVar27);
          goto LAB_0014ad8b;
        }
        pcVar27 = "Unsupported block header size (was %d, max is 2)";
        goto LAB_0014aed8;
      }
LAB_0014a084:
      prVar34 = (rar5 *)a->format->data;
      bVar13 = *(byte *)&prVar34->cstate;
      *(byte *)&prVar34->cstate = bVar13 & 0xfd;
      if ((prVar34->cstate).filters.size == 0) {
LAB_0014a0da:
        *(byte *)&prVar34->cstate = bVar13 | 2;
        if ((prVar8->cstate).filters.size == 0) {
          lVar23 = (prVar8->cstate).write_ptr;
        }
        else {
          lVar25 = *(long *)((prVar8->cstate).filters.arr[(prVar8->cstate).filters.beg_pos] + 0x10);
          lVar23 = (prVar8->cstate).write_ptr;
          if (lVar25 < lVar23) {
            lVar23 = lVar25;
          }
        }
        lVar25 = (prVar8->cstate).last_write_ptr;
        wVar18 = L'\xfffffff6';
        if (lVar23 == lVar25) goto LAB_0014adc6;
        push_window_data(a,prVar8,lVar25,lVar23);
        (prVar8->cstate).last_write_ptr = lVar23;
        goto LAB_0014af2a;
      }
      puVar21 = (uint *)(prVar34->cstate).filters.arr[(prVar34->cstate).filters.beg_pos];
      lVar23 = (prVar34->cstate).write_ptr;
      lVar25 = *(long *)(puVar21 + 4);
      table._0_8_ = puVar21;
      if ((lVar23 <= lVar25) || (lVar23 < *(long *)(puVar21 + 6) + lVar25)) goto LAB_0014a0da;
      lVar23 = (prVar34->cstate).last_write_ptr;
      if (lVar23 != lVar25) {
        push_window_data(a,prVar34,lVar23,lVar25);
        goto LAB_0014af2a;
      }
      prVar8 = (rar5 *)a->format->data;
      free((prVar8->cstate).filtered_buf);
      prVar35 = *(rar5 **)(puVar21 + 6);
      puVar39 = (uint8_t *)malloc((size_t)prVar35);
      (prVar8->cstate).filtered_buf = puVar39;
      if (puVar39 == (uint8_t *)0x0) {
        pcVar27 = "Can\'t allocate memory for filter data.";
        iVar16 = 0xc;
        goto LAB_00149f0d;
      }
      uVar38 = *puVar21;
      if (1 < uVar38 - 1) {
        if (uVar38 == 3) {
          puVar20 = (prVar8->cstate).window_buf;
          uVar28 = (prVar8->cstate).window_mask;
          uVar31 = *(long *)(puVar21 + 4) + (prVar8->cstate).solid_offset;
          prVar32 = (rar5 *)(uVar31 & uVar28);
          local_268 = (rar5 *)((long)&prVar35->header_initialized + uVar31 & uVar28);
          if (local_268 < prVar32) {
            local_248 = puVar20;
            memcpy(puVar39,puVar20 + (long)&prVar32->header_initialized,(uVar28 - (long)prVar32) + 1
                  );
            puVar39 = puVar39 + (uVar28 - (long)prVar32) + 1;
            prVar32 = local_268;
            puVar20 = local_248;
          }
          else {
            puVar20 = puVar20 + (long)prVar32;
            prVar32 = prVar35;
          }
          memcpy(puVar39,puVar20,(size_t)prVar32);
          for (uVar28 = 0; (long)uVar28 < (long)&prVar35[-1].field_0x532d; uVar28 = uVar28 + 4) {
            lVar23 = (prVar8->cstate).solid_offset + *(long *)(puVar21 + 4);
            uVar31 = (prVar8->cstate).window_mask;
            if ((prVar8->cstate).window_buf[uVar28 + lVar23 + 3 & uVar31] == 0xeb) {
              uVar17 = read_filter_data(prVar8,(int)lVar23 + (int)uVar28 & (uint)uVar31);
              iVar16 = (int)((long)(*(long *)(puVar21 + 4) + uVar28) / -4) + uVar17;
              puVar39 = (prVar8->cstate).filtered_buf;
              uVar31 = uVar28 & 0xffffffff;
              puVar39[uVar31] = (uint8_t)iVar16;
              puVar39[uVar31 + 1] = (uint8_t)((uint)iVar16 >> 8);
              puVar39[uVar31 + 2] = (uint8_t)((uint)iVar16 >> 0x10);
              puVar39[uVar31 + 3] = 0xeb;
              prVar35 = *(rar5 **)(puVar21 + 6);
            }
          }
        }
        else {
          if (uVar38 != 0) {
            pcVar27 = "Unsupported filter type: 0x%x";
            uVar28 = (ulong)uVar38;
            a = local_270;
            goto LAB_0014aed8;
          }
          uVar28 = (ulong)puVar21[1];
          lVar25 = 0;
          for (lVar23 = 0; lVar23 < (int)uVar28; lVar23 = lVar23 + 1) {
            uVar30 = '\0';
            for (lVar33 = lVar23; lVar33 < (long)prVar35; lVar33 = lVar33 + uVar28) {
              uVar30 = uVar30 - (prVar8->cstate).window_buf
                                [(prVar8->cstate).solid_offset + *(long *)(puVar21 + 4) + lVar25 &
                                 (prVar8->cstate).window_mask];
              (prVar8->cstate).filtered_buf[lVar33] = uVar30;
              lVar25 = lVar25 + 1;
              uVar28 = (ulong)(int)puVar21[1];
              prVar35 = *(rar5 **)(puVar21 + 6);
            }
          }
        }
LAB_0014b331:
        wVar18 = push_data_ready(local_270,prVar8,(prVar8->cstate).filtered_buf,(size_t)prVar35,
                                 (prVar8->cstate).last_write_ptr);
        if (wVar18 != L'\0') {
          pcVar27 = "Stack overflow when submitting unpacked data";
          iVar16 = 0x16;
          a = local_270;
          goto LAB_00149f0d;
        }
        piVar3 = &(prVar8->cstate).last_write_ptr;
        *piVar3 = *piVar3 + *(long *)(puVar21 + 6);
        cdeque_pop_front(&(prVar34->cstate).filters,(void **)table);
        free((void *)table._0_8_);
        a = local_270;
        goto LAB_0014af2a;
      }
      puVar20 = (prVar8->cstate).window_buf;
      uVar28 = (prVar8->cstate).window_mask;
      uVar31 = *(long *)(puVar21 + 4) + (prVar8->cstate).solid_offset;
      prVar32 = (rar5 *)(uVar31 & uVar28);
      local_268 = (rar5 *)((long)&prVar35->header_initialized + uVar31 & uVar28);
      if (local_268 < prVar32) {
        local_248 = puVar20;
        local_230 = puVar39;
        memcpy(puVar39,puVar20 + (long)&prVar32->header_initialized,(uVar28 - (long)prVar32) + 1);
        puVar39 = local_230 + (uVar28 - (long)prVar32) + 1;
        prVar32 = local_268;
        puVar20 = local_248;
      }
      else {
        puVar20 = puVar20 + (long)prVar32;
        prVar32 = prVar35;
      }
      memcpy(puVar39,puVar20,(size_t)prVar32);
      uVar28 = 0;
      goto LAB_0014b1d3;
    }
    if (wVar18 != L'\0') {
      pcVar27 = "Compression method not supported: 0x%x";
LAB_0014aed8:
      archive_set_error(&a->archive,0x54,pcVar27,uVar28);
      return L'\xffffffe2';
    }
  }
  sVar19 = (prVar8->file).bytes_remaining;
  if (sVar19 == 0) {
    wVar14 = L'\x01';
    wVar18 = wVar14;
    if ((((ulong)prVar8->main & 2) != 0) &&
       ((undefined1  [12])((undefined1  [12])prVar8->generic & (undefined1  [12])0x1) !=
        (undefined1  [12])0x0)) {
      *(byte *)&prVar8->cstate = *(byte *)&prVar8->cstate | 4;
      wVar18 = advance_multivolume(a);
      *(byte *)&prVar8->cstate = *(byte *)&prVar8->cstate & 0xfb;
      a = local_270;
      if (wVar18 == L'\0') {
        sVar19 = (local_240->file).bytes_remaining;
        sVar37 = 0x10000;
        if ((long)sVar19 < 0x10000) {
          sVar37 = sVar19;
        }
        wVar18 = wVar14;
        if (sVar19 != 0) goto LAB_0014adfc;
      }
    }
  }
  else {
    sVar37 = 0x10000;
    if ((long)sVar19 < 0x10000) {
      sVar37 = sVar19;
    }
LAB_0014adfc:
    a_00 = local_270;
    wVar18 = read_ahead(local_270,sVar37,(uint8_t **)table);
    if (wVar18 == L'\0') {
      archive_set_error(&a_00->archive,0x54,"I/O error when unstoring file");
      a = local_270;
      wVar18 = L'\xffffffe2';
    }
    else {
      wVar18 = consume(a_00,sVar37);
      if (wVar18 == L'\0') {
        if (buff != (void **)0x0) {
          *buff = (void *)table._0_8_;
        }
        if (size != (size_t *)0x0) {
          *size = sVar37;
        }
        lVar23 = (local_240->cstate).last_unstore_ptr;
        if (offset != (int64_t *)0x0) {
          *offset = lVar23;
        }
        (local_240->file).bytes_remaining = (local_240->file).bytes_remaining - sVar37;
        (local_240->cstate).last_unstore_ptr = lVar23 + sVar37;
        update_crc(local_240,(uint8_t *)table._0_8_,sVar37);
        a = local_270;
        wVar18 = L'\0';
      }
      else {
        a = local_270;
        wVar18 = L'\x01';
      }
    }
  }
LAB_0014af20:
  if (wVar18 != L'\0') {
    return wVar18;
  }
LAB_0014af2a:
  if ((local_240->file).bytes_remaining != 0) {
    return L'\0';
  }
  if ((local_240->cstate).last_write_ptr != (local_240->file).unpacked_size) {
    return L'\0';
  }
  puVar2 = &(local_240->file).field_0x20;
  *puVar2 = *puVar2 | 4;
  pvVar9 = a->format->data;
  if (*(int *)((long)pvVar9 + 8) != 0) {
    return L'\0';
  }
  if ((*(int *)((long)pvVar9 + 0x4bec) == 0) ||
     (*(int *)((long)pvVar9 + 0x4bf0) == *(int *)((long)pvVar9 + 0x4bec))) {
    if (*(char *)((long)pvVar9 + 0x52f0) < '\x01') {
      return L'\0';
    }
    blake2sp_final((blake2sp_state *)((long)pvVar9 + 0x4c18),table,0x20);
    iVar16 = bcmp((void *)((long)pvVar9 + 0x4bf4),table,0x20);
    if (iVar16 == 0) {
      return L'\0';
    }
    pcVar27 = "Checksum error: BLAKE2";
  }
  else {
    pcVar27 = "Checksum error: CRC32";
  }
LAB_0014afdd:
  iVar16 = 0x54;
LAB_00149f0d:
  archive_set_error(&a->archive,iVar16,pcVar27);
  return L'\xffffffe2';
LAB_0014aa4f:
  if ((int)uVar38 < 0x1ae) {
    wVar18 = decode_number(a,pdVar40,puVar39,&num);
    prVar34 = local_268;
    if (wVar18 != L'\0') {
      iVar16 = 0x54;
      pcVar27 = "Decoding huffman tables failed";
      goto LAB_0014ad84;
    }
    uVar12 = num;
    if (num < 0x10) {
      table[(int)uVar38] = (uint8_t)_num;
      uVar38 = uVar38 + 1;
    }
    else if (num < 0x12) {
      wVar18 = read_bits_16(a,local_268,puVar39,&local_272);
      if (wVar18 != L'\0') goto LAB_0014ad8e;
      iVar16 = (int)(prVar34->bits).bit_addr + (uint)(uVar12 != 0x10) * 4 + 3;
      pwVar1 = &(prVar34->bits).in_addr;
      *pwVar1 = *pwVar1 + (iVar16 >> 3);
      (prVar34->bits).bit_addr = (byte)iVar16 & 7;
      if ((int)uVar38 < 1) {
        iVar16 = 0x54;
        pcVar27 = "Unexpected error when decoding huffman tables";
        goto LAB_0014ad84;
      }
      for (lVar23 = 0;
          (iVar16 = (int)lVar23,
          (ushort)((((ushort)(uVar12 == 0x10) << 3 | 0xfff5) -
                   (local_272 >> ((uVar12 == 0x10) * '\x04' | 9U))) + (short)lVar23) != 0 &&
          ((int)(uVar38 + iVar16) < 0x1ae)); lVar23 = lVar23 + 1) {
        table[lVar23 + (ulong)uVar38] = table[(uVar38 - 1) + iVar16];
      }
      uVar38 = uVar38 + iVar16;
      puVar39 = local_260;
      prVar34 = local_268;
    }
    else {
      wVar18 = read_bits_16(a,local_268,puVar39,&local_272);
      if (wVar18 != L'\0') goto LAB_0014ad8e;
      bVar41 = uVar12 == 0x12;
      iVar16 = (int)(prVar34->bits).bit_addr + (uint)!bVar41 * 4 + 3;
      pwVar1 = &(prVar34->bits).in_addr;
      *pwVar1 = *pwVar1 + (iVar16 >> 3);
      (prVar34->bits).bit_addr = (byte)iVar16 & 7;
      iVar16 = 0;
      for (lVar23 = (long)(int)uVar38;
          ((ushort)(((ushort)bVar41 * 8 | 0xfff5) - (local_272 >> (bVar41 << 2 | 9U))) !=
           (short)iVar16 && (lVar23 < 0x1ae)); lVar23 = lVar23 + 1) {
        table[lVar23] = '\0';
        iVar16 = iVar16 + -1;
      }
      uVar38 = uVar38 - iVar16;
      puVar39 = local_260;
    }
    goto LAB_0014aa4f;
  }
  create_decode_tables(table,&(prVar34->cstate).ld,L'Ĳ');
  create_decode_tables(table + 0x132,&(prVar34->cstate).dd,L'@');
  create_decode_tables(table + 0x172,&(prVar34->cstate).ldd,L'\x10');
  create_decode_tables(table + 0x182,&(prVar34->cstate).rd,L',');
LAB_0014a2a9:
  prVar35 = (rar5 *)a->format->data;
  local_230 = (uint8_t *)(prVar35->cstate).window_mask;
  local_248 = (uint8_t *)
              (CONCAT71(local_248._1_7_,(prVar35->last_block_hdr).block_flags_u8) &
              0xffffffffffffff07);
  local_238 = &(prVar35->cstate).ld;
  puVar39 = p;
  pdVar40 = local_238;
LAB_0014a2ff:
  if ((prVar35->cstate).window_size >> 1 <
      (prVar35->cstate).write_ptr - (prVar35->cstate).last_write_ptr) {
LAB_0014a7e1:
    bVar13 = *(byte *)&prVar34->cstate;
    if ((bVar13 & 0xc) == 8) {
      lVar23 = (prVar34->cstate).cur_block_size;
      if (0 < lVar23) {
        wVar18 = consume(a,lVar23);
        if (wVar18 != L'\0') {
          return L'\xffffffe2';
        }
        (prVar34->file).bytes_remaining =
             (prVar34->file).bytes_remaining - (prVar34->cstate).cur_block_size;
      }
    }
    else if ((bVar13 & 4) != 0) {
      *(byte *)&prVar34->cstate = bVar13 & 0xfb;
    }
    goto LAB_0014ad98;
  }
  lVar25 = (long)(prVar35->bits).in_addr;
  lVar23 = (prVar35->cstate).cur_block_size;
  if ((lVar23 <= lVar25) ||
     ((lVar23 + -1 == lVar25 && ((char)local_248 < (prVar35->bits).bit_addr)))) {
    *(byte *)&prVar35->cstate = *(byte *)&prVar35->cstate | 8;
    goto LAB_0014a7e1;
  }
  wVar18 = decode_number(a,pdVar40,puVar39,&num_1);
  if (wVar18 != L'\0') goto LAB_0014aa16;
  if (num_1 < 0x100) {
    lVar23 = (prVar35->cstate).write_ptr;
    (prVar35->cstate).write_ptr = lVar23 + 1;
    (prVar35->cstate).window_buf[lVar23 + (prVar35->cstate).solid_offset & (ulong)local_230] =
         (uint8_t)num_1;
    goto LAB_0014a2ff;
  }
  if (num_1 < 0x106) {
    if (num_1 == 0x101) {
      wVar18 = (prVar35->cstate).last_len;
      if ((wVar18 != L'\0') &&
         (wVar18 = copy_string(a,wVar18,(prVar35->cstate).dist_cache[0]), wVar18 != L'\0'))
      goto LAB_0014ad8b;
      goto LAB_0014a2ff;
    }
    if (num_1 == 0x100) {
      prVar32 = (rar5 *)a->format->data;
      wVar18 = parse_filter_data(a,prVar32,puVar39,(uint32_t *)table);
      if (((wVar18 != L'\0') ||
          (wVar18 = parse_filter_data(a,prVar32,puVar39,(uint32_t *)bit_length), wVar18 != L'\0'))
         || (local_260 = puVar39, wVar18 = read_bits_16(a,prVar32,puVar39,&local_272),
            uVar11 = local_272, wVar18 != L'\0')) goto LAB_0014ad8e;
      iVar16 = (prVar32->bits).bit_addr + 3;
      pwVar1 = &(prVar32->bits).in_addr;
      *pwVar1 = *pwVar1 + (iVar16 >> 3);
      (prVar32->bits).bit_addr = (byte)iVar16 & 7;
      uVar28 = (ulong)(uint)bit_length._0_4_;
      if ((0xffc00002 < bit_length._0_4_ - 0x400001) && (-1 < (short)local_272)) {
        uVar31 = table._0_8_ & 0xffffffff;
        lVar23 = (prVar32->cstate).last_block_start;
        lVar25 = (prVar32->cstate).last_block_length;
        if ((lVar25 == 0 || lVar23 == 0) ||
           (lVar25 + lVar23 <= (long)((prVar32->cstate).write_ptr + uVar31))) {
          puVar21 = (uint *)calloc(1,0x28);
          if (puVar21 == (uint *)0x0) {
            iVar16 = 0xc;
            pcVar27 = "Can\'t allocate memory for a filter descriptor.";
            goto LAB_0014ad84;
          }
          uVar5 = (prVar32->cstate).filters.size;
          uVar6 = (prVar32->cstate).filters.cap_mask;
          if (uVar6 + 1 != (uint)uVar5) {
            uVar7 = (prVar32->cstate).filters.end_pos;
            (prVar32->cstate).filters.arr[uVar7] = (size_t)puVar21;
            (prVar32->cstate).filters.end_pos = uVar6 & uVar7 + 1;
            (prVar32->cstate).filters.size = uVar5 + 1;
          }
          *puVar21 = (uint)(uVar11 >> 0xd);
          lVar23 = uVar31 + (prVar32->cstate).write_ptr;
          *(long *)(puVar21 + 4) = lVar23;
          *(ulong *)(puVar21 + 6) = uVar28;
          (prVar32->cstate).last_block_start = lVar23;
          (prVar32->cstate).last_block_length = uVar28;
          puVar39 = local_260;
          prVar34 = local_268;
          pdVar40 = local_238;
          if (uVar11 < 0x2000) {
            wVar18 = read_consume_bits(a,prVar32,local_260,L'\x05',(wchar_t *)&num);
            if (wVar18 != L'\0') goto LAB_0014ad8e;
            puVar21[1] = _num + L'\x01';
            puVar39 = local_260;
            prVar34 = local_268;
            pdVar40 = local_238;
          }
          goto LAB_0014a2ff;
        }
      }
      iVar16 = 0x54;
      pcVar27 = "Invalid filter encountered";
      goto LAB_0014ad84;
    }
    uVar28 = (ulong)(num_1 - 0x102);
    wVar18 = (prVar35->cstate).dist_cache[uVar28];
    for (; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
      (prVar35->cstate).dist_cache[uVar28] = (prVar35->cstate).dist_cache[uVar28 - 1];
    }
    (prVar35->cstate).dist_cache[0] = wVar18;
    wVar14 = decode_number(a,&(prVar35->cstate).rd,puVar39,(uint16_t *)table);
    if (wVar14 != L'\0') goto LAB_0014ad8b;
    wVar14 = decode_code_length(a,prVar35,puVar39,table._0_2_);
    if (wVar14 == L'\xffffffff') goto LAB_0014ad8b;
    (prVar35->cstate).last_len = wVar14;
    wVar18 = copy_string(a,wVar14,wVar18);
  }
  else {
    wVar14 = decode_code_length(a,prVar35,puVar39,num_1 - 0x106);
    if (wVar14 == L'\xffffffff') {
      iVar16 = 0x16;
      pcVar27 = "Failed to decode the code length";
      goto LAB_0014ad84;
    }
    wVar18 = decode_number(a,&(prVar35->cstate).dd,puVar39,(uint16_t *)bit_length);
    if (wVar18 != L'\0') {
LAB_0014ac37:
      iVar16 = 0x16;
      pcVar27 = "Failed to decode the distance slot";
      goto LAB_0014ad84;
    }
    if ((ushort)bit_length._0_2_ < 4) {
      wVar18 = (bit_length._0_4_ & 0xffff) + L'\x01';
    }
    else {
      uVar11 = (ushort)bit_length._0_2_ >> 1;
      wVar18 = (uint)uVar11 + L'\xffffffff';
      iVar16 = ((bit_length._0_4_ & 1 | 2) << ((byte)wVar18 & 0x1f)) + 1;
      if ((uint)wVar18 < 4) {
        wVar18 = read_consume_bits(a,prVar35,puVar39,wVar18,(wchar_t *)table);
        if (wVar18 != L'\0') goto LAB_0014ad8e;
        wVar18 = iVar16 + table._0_4_;
      }
      else {
        if (wVar18 != L'\x04') {
          wVar18 = (prVar35->bits).in_addr;
          lVar23 = (long)wVar18;
          if ((prVar35->cstate).cur_block_size <= lVar23) {
            iVar16 = 0x16;
            pcVar27 = "Premature end of stream during extraction of data (#1)";
            goto LAB_0014ad84;
          }
          uVar38 = *(uint *)(puVar39 + lVar23);
          bVar13 = (prVar35->bits).bit_addr;
          bVar26 = puVar39[lVar23 + 4];
          iVar15 = (int)(char)bVar13 + (uint)uVar11 + -5;
          (prVar35->bits).in_addr = (iVar15 >> 3) + wVar18;
          (prVar35->bits).bit_addr = (byte)iVar15 & 7;
          iVar16 = iVar16 + (((uint)(bVar26 >> (8 - bVar13 & 0x1f)) |
                             (uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8 |
                             uVar38 << 0x18) << (bVar13 & 0x1f)) >> (0x25U - (char)uVar11 & 0x1f)) *
                            0x10;
        }
        wVar18 = decode_number(a,&(prVar35->cstate).ldd,puVar39,(uint16_t *)table);
        if (wVar18 != L'\0') goto LAB_0014ac37;
        if ((int)(0x7ffffffe - (uint)(ushort)table._0_2_) <= iVar16) {
          iVar16 = 0x54;
          pcVar27 = "Distance pointer overflow";
          goto LAB_0014ad84;
        }
        wVar18 = iVar16 + (uint)(ushort)table._0_2_;
      }
    }
    if (L'Ā' < wVar18) {
      if ((uint)wVar18 < 0x2001) {
        wVar14 = wVar14 + L'\x01';
      }
      else {
        wVar14 = (wVar14 - (uint)((uint)wVar18 < 0x40001)) + L'\x03';
      }
    }
    (prVar35->cstate).dist_cache[3] = (prVar35->cstate).dist_cache[2];
    *(undefined8 *)((prVar35->cstate).dist_cache + 1) = *(undefined8 *)(prVar35->cstate).dist_cache;
    (prVar35->cstate).dist_cache[0] = wVar18;
    (prVar35->cstate).last_len = wVar14;
    wVar18 = copy_string(a,wVar14,wVar18);
    prVar34 = local_268;
  }
  pdVar40 = local_238;
  if (wVar18 == L'\0') goto LAB_0014a2ff;
LAB_0014ad8b:
  wVar18 = L'\xffffffe2';
LAB_0014ad8e:
  if ((wVar18 == L'\xffffffe2') || (wVar18 == L'\x01')) goto LAB_0014adc6;
LAB_0014ad98:
  if ((prVar8->cstate).last_write_ptr != (prVar8->cstate).write_ptr) goto LAB_0014a084;
  goto LAB_0014a11e;
LAB_0014aa16:
  wVar18 = L'\x01';
  goto LAB_0014ad8e;
LAB_0014adc6:
  if (wVar18 != L'\xfffffff6') goto LAB_0014af20;
  goto LAB_00149fbd;
LAB_0014b1d3:
  do {
    uVar31 = uVar28;
    if ((long)&prVar35[-1].field_0x532c <= (long)uVar31) goto LAB_0014b331;
    lVar23 = (prVar8->cstate).solid_offset;
    lVar25 = *(long *)(puVar21 + 4);
    uVar28 = uVar31 + 1;
    uVar10 = (prVar8->cstate).window_mask;
    uVar30 = (prVar8->cstate).window_buf[lVar25 + lVar23 + uVar31 & uVar10];
  } while ((uVar30 != 0xe8) && (uVar38 != 2 || uVar30 != 0xe9));
  uVar17 = read_filter_data(prVar8,(uint)uVar10 & (int)uVar28 + (int)lVar23 + (int)lVar25);
  iVar16 = (int)((long)(lVar25 + uVar28) % 0x1000000);
  if ((int)uVar17 < 0) {
    if (-1 < (int)(iVar16 + uVar17)) {
      uVar24 = uVar17 + 0x1000000;
      goto LAB_0014b269;
    }
  }
  else if (uVar17 < 0x1000000) {
    uVar17 = uVar17 - iVar16;
    uVar24 = uVar17;
LAB_0014b269:
    puVar39 = (prVar8->cstate).filtered_buf;
    uVar28 = uVar28 & 0xffffffff;
    puVar39[uVar28] = (uint8_t)uVar17;
    puVar39[uVar28 + 1] = (uint8_t)(uVar17 >> 8);
    puVar39[uVar28 + 2] = (uint8_t)(uVar17 >> 0x10);
    puVar39[uVar28 + 3] = (uint8_t)(uVar24 >> 0x18);
  }
  uVar28 = uVar31 + 5;
  prVar35 = *(rar5 **)(puVar21 + 6);
  goto LAB_0014b1d3;
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}